

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument.cpp
# Opt level: O2

void __thiscall QTextDocument::print(QTextDocument *this,QPagedPaintDevice *printer)

{
  bool bVar1;
  bool bVar2;
  undefined4 extraout_EAX;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  QAbstractTextDocumentLayout *pQVar7;
  QPaintDevice *pQVar8;
  undefined4 extraout_var;
  QTextLayout *this_00;
  QTextLayout *this_01;
  QTextObject *this_02;
  QAbstractTextDocumentLayout *pQVar9;
  undefined8 in_RCX;
  long lVar10;
  void *__child_stack;
  undefined8 *puVar11;
  PaintContext *pPVar12;
  void *in_R8;
  long in_FS_OFFSET;
  byte bVar13;
  double dVar14;
  double sy;
  double dVar15;
  double dVar16;
  undefined1 auVar17 [16];
  double local_158;
  QTextDocument *local_148;
  double local_138;
  double local_130;
  double local_128;
  QTextDocument *local_118;
  QPageRanges pageRanges;
  QPainter p;
  QMarginsF local_f8;
  QTextBlock local_d8;
  QArrayDataPointer<char16_t> local_c8;
  PaintContext ctx;
  QRectF local_58;
  long local_38;
  
  iVar6 = (int)in_RCX;
  bVar13 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (printer != (QPagedPaintDevice *)0x0) {
    lVar10 = *(long *)&this->field_0x8;
    bVar2 = false;
    if ((0.0 <= *(double *)(lVar10 + 0x298)) &&
       (dVar14 = *(double *)(lVar10 + 0x2a0), bVar2 = false, 0.0 <= dVar14)) {
      iVar6 = (int)CONCAT71((int7)((ulong)in_RCX >> 8),NAN(dVar14));
      bVar2 = dVar14 != 2147483647.0 && (*(double *)(lVar10 + 0x298) != 0.0 || dVar14 != 0.0);
    }
    local_f8.m_right = -NAN;
    local_f8.m_bottom = -NAN;
    local_f8.m_left = -NAN;
    local_f8.m_top = -NAN;
    QPagedPaintDevice::pageLayout((QPagedPaintDevice *)&ctx);
    QPageLayout::margins(&local_f8,(QPageLayout *)&ctx,Millimeter);
    QPageLayout::~QPageLayout((QPageLayout *)&ctx);
    auVar17._4_4_ = -(uint)(local_f8.m_top != 0.0);
    auVar17._0_4_ = -(uint)(local_f8.m_left != 0.0);
    auVar17._8_4_ = -(uint)(local_f8.m_right != 0.0);
    auVar17._12_4_ = -(uint)(local_f8.m_bottom != 0.0);
    iVar3 = movmskps(extraout_EAX,auVar17);
    if ((iVar3 == 0) && (!bVar2)) {
      local_f8.m_left = 2.0;
      local_f8.m_top = 2.0;
      local_f8.m_right = 2.0;
      local_f8.m_bottom = 2.0;
      (*(printer->super_QPaintDevice)._vptr_QPaintDevice[0xc])(printer,&local_f8,0);
    }
    p.d_ptr._M_t.super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>._M_t.
    super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
    super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl =
         (unique_ptr<QPainterPrivate,_std::default_delete<QPainterPrivate>_>)&DAT_aaaaaaaaaaaaaaaa;
    QPainter::QPainter(&p,&printer->super_QPaintDevice);
    bVar1 = QPainter::isActive(&p);
    if (bVar1) {
      documentLayout(this);
      local_138 = *(double *)(lVar10 + 0x298);
      local_130 = *(double *)(lVar10 + 0x2a0);
      iVar3 = qt_defaultDpiX();
      iVar4 = qt_defaultDpiY();
      iVar5 = (*(printer->super_QPaintDevice)._vptr_QPaintDevice[4])(printer,7);
      dVar14 = (double)iVar5 / (double)iVar3;
      iVar5 = (*(printer->super_QPaintDevice)._vptr_QPaintDevice[4])(printer,8);
      sy = (double)iVar5 / (double)iVar4;
      if (bVar2) {
        pQVar7 = (QAbstractTextDocumentLayout *)documentLayout(this);
        pQVar8 = QAbstractTextDocumentLayout::paintDevice(pQVar7);
        if (pQVar8 != (QPaintDevice *)0x0) {
          (*pQVar8->_vptr_QPaintDevice[4])(pQVar8,7);
          (*pQVar8->_vptr_QPaintDevice[4])(pQVar8,8);
        }
        QPainter::scale(&p,dVar14,sy);
        dVar15 = *(double *)(lVar10 + 0x298);
        dVar16 = *(double *)(lVar10 + 0x2a0);
        iVar6 = (*(printer->super_QPaintDevice)._vptr_QPaintDevice[4])(printer,1);
        iVar3 = (*(printer->super_QPaintDevice)._vptr_QPaintDevice[4])(printer,2);
        QPainter::scale(&p,(double)iVar6 / (dVar14 * dVar15),(double)iVar3 / (sy * dVar16));
        local_158 = 0.0;
        local_118 = (QTextDocument *)0x0;
        local_128 = 0.0;
        local_148 = this;
      }
      else {
        iVar6 = clone(this,(__fn *)this,__child_stack,iVar6,in_R8);
        local_148 = (QTextDocument *)CONCAT44(extraout_var,iVar6);
        local_58.xp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
        local_58.yp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
        firstBlock((QTextDocument *)&local_58);
        local_c8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_c8.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        firstBlock((QTextDocument *)&local_c8);
        while ((bVar2 = QTextBlock::isValid((QTextBlock *)&local_58), bVar2 &&
               (bVar2 = QTextBlock::isValid((QTextBlock *)&local_c8), bVar2))) {
          this_00 = QTextBlock::layout((QTextBlock *)&local_c8);
          this_01 = QTextBlock::layout((QTextBlock *)&local_58);
          QTextLayout::formats((QList<QTextLayout::FormatRange> *)&ctx,this_01);
          QTextLayout::setFormats(this_00,(QList<QTextLayout::FormatRange> *)&ctx);
          QArrayDataPointer<QTextLayout::FormatRange>::~QArrayDataPointer
                    ((QArrayDataPointer<QTextLayout::FormatRange> *)&ctx);
          QTextBlock::next((QTextBlock *)&ctx);
          local_58.xp = (qreal)ctx._0_8_;
          local_58.yp = (qreal)CONCAT44(local_58.yp._4_4_,ctx.palette.d._0_4_);
          QTextBlock::next(&local_d8);
          local_c8.d = (Data *)local_d8.p;
          local_c8.ptr = (char16_t *)CONCAT44(local_c8.ptr._4_4_,local_d8.n);
        }
        pQVar7 = (QAbstractTextDocumentLayout *)documentLayout(local_148);
        pQVar8 = QPainter::device(&p);
        QAbstractTextDocumentLayout::setPaintDevice(pQVar7,pQVar8);
        pQVar9 = documentLayout(this);
        QHash<int,_QTextObjectHandler>::operator=
                  ((QHash<int,_QTextObjectHandler> *)(*(long *)(pQVar7 + 8) + 0x78),
                   (QHash<int,_QTextObjectHandler> *)(*(long *)&pQVar9->field_0x8 + 0x78));
        ctx._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        ctx.palette.d = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
        rootFrame(local_148);
        QTextFrame::frameFormat((QTextFrame *)&ctx);
        dVar15 = (double)(int)((double)iVar3 * 0.7874015748031495);
        QTextFrameFormat::setLeftMargin((QTextFrameFormat *)&ctx,dVar15);
        QTextFrameFormat::setRightMargin((QTextFrameFormat *)&ctx,dVar15);
        dVar16 = (double)(int)((double)iVar4 * 0.7874015748031495);
        QTextFrameFormat::setTopMargin((QTextFrameFormat *)&ctx,dVar16);
        QTextFrameFormat::setBottomMargin((QTextFrameFormat *)&ctx,dVar16);
        this_02 = &rootFrame(local_148)->super_QTextObject;
        QTextObject::setFormat(this_02,(QTextFormat *)&ctx);
        pQVar8 = QPainter::device(&p);
        iVar6 = (*pQVar8->_vptr_QPaintDevice[4])(pQVar8,8);
        iVar3 = (*(printer->super_QPaintDevice)._vptr_QPaintDevice[4])(printer,1);
        local_138 = (double)iVar3;
        iVar3 = (*(printer->super_QPaintDevice)._vptr_QPaintDevice[4])(printer,2);
        local_130 = (double)iVar3;
        local_128 = local_138 - dVar14 * dVar15;
        defaultFont((QTextDocument *)&local_58);
        pQVar8 = QPainter::device(&p);
        QFontMetrics::QFontMetrics((QFontMetrics *)&local_c8,(QFont *)&local_58,pQVar8);
        iVar3 = QFontMetrics::ascent((QFontMetrics *)&local_c8);
        local_158 = (double)(iVar6 * 5) / 72.0 + (double)iVar3 + (local_130 - sy * dVar16);
        QFontMetrics::~QFontMetrics((QFontMetrics *)&local_c8);
        QFont::~QFont((QFont *)&local_58);
        local_58.xp = local_138;
        local_58.yp = local_130;
        setPageSize(local_148,(QSizeF *)&local_58);
        QTextFormat::~QTextFormat((QTextFormat *)&ctx);
        local_118 = local_148;
      }
      pageRanges.d.d.ptr = (QExplicitlySharedDataPointer<QPageRangesPrivate>)&DAT_aaaaaaaaaaaaaaaa;
      QPagedPaintDevice::pageRanges((QPagedPaintDevice *)&pageRanges);
      iVar3 = QPageRanges::firstPage(&pageRanges);
      iVar6 = QPageRanges::lastPage(&pageRanges);
      if (iVar6 == 0 && iVar3 == 0) {
        iVar6 = pageCount(local_148);
        iVar4 = 1;
      }
      else {
        iVar4 = 1;
        if (1 < iVar3) {
          iVar4 = iVar3;
        }
      }
      iVar3 = pageCount(local_148);
      if (iVar3 < iVar6) {
        iVar6 = iVar3;
      }
      if (iVar4 <= iVar6) {
        do {
          bVar2 = QPageRanges::isEmpty(&pageRanges);
          if ((bVar2) || (bVar2 = QPageRanges::contains(&pageRanges,iVar4), bVar2)) {
            QPainter::save(&p);
            dVar14 = (double)(iVar4 + -1) * local_130;
            QPainter::translate(&p,0.0,0.0 - dVar14);
            local_58.xp = 0.0;
            local_58.w = local_138;
            local_58.h = local_130;
            local_58.yp = dVar14;
            pQVar9 = documentLayout(local_148);
            puVar11 = &DAT_005fa858;
            pPVar12 = &ctx;
            for (lVar10 = 10; lVar10 != 0; lVar10 = lVar10 + -1) {
              *(undefined8 *)pPVar12 = *puVar11;
              puVar11 = puVar11 + (ulong)bVar13 * -2 + 1;
              pPVar12 = (PaintContext *)((long)pPVar12 + (ulong)bVar13 * -0x10 + 8);
            }
            QAbstractTextDocumentLayout::PaintContext::PaintContext(&ctx);
            QPainter::setClipRect(&p,&local_58,ReplaceClip);
            ctx.clip.w = local_58.w;
            ctx.clip.h = local_58.h;
            ctx.clip.xp = local_58.xp;
            ctx.clip.yp = local_58.yp;
            QColor::QColor((QColor *)&local_c8,black);
            QPalette::setColor(&ctx.palette,Text,(QColor *)&local_c8);
            (**(code **)(*(long *)pQVar9 + 0x60))(pQVar9,&p,&ctx);
            if (local_128 != 0.0 || local_158 != 0.0) {
              QPainter::setClipping(&p,false);
              defaultFont((QTextDocument *)&local_c8);
              QPainter::setFont(&p,(QFont *)&local_c8);
              QFont::~QFont((QFont *)&local_c8);
              local_c8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
              local_c8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
              local_c8.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
              QString::number((int)&local_c8,iVar4);
              QPainter::fontMetrics((QPainter *)&local_d8);
              iVar3 = QFontMetrics::horizontalAdvance
                                ((QFontMetrics *)&local_d8,(QString *)&local_c8,-1);
              QPainter::drawText(&p,(int)((double)((ulong)(local_128 - (double)iVar3) &
                                                   0x8000000000000000 | 0x3fe0000000000000) +
                                         (local_128 - (double)iVar3)),
                                 (int)((double)((ulong)(local_58.yp + local_158) &
                                                0x8000000000000000 | 0x3fe0000000000000) +
                                      local_58.yp + local_158),(QString *)&local_c8);
              QFontMetrics::~QFontMetrics((QFontMetrics *)&local_d8);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
            }
            QPainter::restore(&p);
            QAbstractTextDocumentLayout::PaintContext::~PaintContext(&ctx);
          }
          if (iVar6 == iVar4) break;
          iVar4 = iVar4 + 1;
          iVar3 = (*(printer->super_QPaintDevice)._vptr_QPaintDevice[8])();
        } while ((char)iVar3 != '\0');
      }
      QPageRanges::~QPageRanges(&pageRanges);
      if (local_118 != (QTextDocument *)0x0) {
        (**(code **)(*(long *)local_118 + 0x20))();
      }
    }
    QPainter::~QPainter(&p);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextDocument::print(QPagedPaintDevice *printer) const
{
    Q_D(const QTextDocument);

    if (!printer)
        return;

    bool documentPaginated = d->pageSize.isValid() && !d->pageSize.isNull()
                             && d->pageSize.height() != INT_MAX;

    // ### set page size to paginated size?
    QMarginsF m = printer->pageLayout().margins(QPageLayout::Millimeter);
    if (!documentPaginated && m.left() == 0. && m.right() == 0. && m.top() == 0. && m.bottom() == 0.) {
        m.setLeft(2);
        m.setRight(2);
        m.setTop(2);
        m.setBottom(2);
        printer->setPageMargins(m, QPageLayout::Millimeter);
    }
    // ### use the margins correctly

    QPainter p(printer);

    // Check that there is a valid device to print to.
    if (!p.isActive())
        return;

    const QTextDocument *doc = this;
    QScopedPointer<QTextDocument> clonedDoc;
    (void)doc->documentLayout(); // make sure that there is a layout

    QRectF body = QRectF(QPointF(0, 0), d->pageSize);
    QPointF pageNumberPos;

    qreal sourceDpiX = qt_defaultDpiX();
    qreal sourceDpiY = qt_defaultDpiY();
    const qreal dpiScaleX = qreal(printer->logicalDpiX()) / sourceDpiX;
    const qreal dpiScaleY = qreal(printer->logicalDpiY()) / sourceDpiY;

    if (documentPaginated) {

        QPaintDevice *dev = doc->documentLayout()->paintDevice();
        if (dev) {
            sourceDpiX = dev->logicalDpiX();
            sourceDpiY = dev->logicalDpiY();
        }

        // scale to dpi
        p.scale(dpiScaleX, dpiScaleY);

        QSizeF scaledPageSize = d->pageSize;
        scaledPageSize.rwidth() *= dpiScaleX;
        scaledPageSize.rheight() *= dpiScaleY;

        const QSizeF printerPageSize(printer->width(), printer->height());

        // scale to page
        p.scale(printerPageSize.width() / scaledPageSize.width(),
                printerPageSize.height() / scaledPageSize.height());
    } else {
        doc = clone(const_cast<QTextDocument *>(this));
        clonedDoc.reset(const_cast<QTextDocument *>(doc));

        for (QTextBlock srcBlock = firstBlock(), dstBlock = clonedDoc->firstBlock();
             srcBlock.isValid() && dstBlock.isValid();
             srcBlock = srcBlock.next(), dstBlock = dstBlock.next()) {
            dstBlock.layout()->setFormats(srcBlock.layout()->formats());
        }

        QAbstractTextDocumentLayout *layout = doc->documentLayout();
        layout->setPaintDevice(p.device());

        // copy the custom object handlers
        layout->d_func()->handlers = documentLayout()->d_func()->handlers;

        // 2 cm margins, scaled to device in QTextDocumentLayoutPrivate::layoutFrame
        const int horizontalMargin = int((2/2.54)*sourceDpiX);
        const int verticalMargin = int((2/2.54)*sourceDpiY);
        QTextFrameFormat fmt = doc->rootFrame()->frameFormat();
        fmt.setLeftMargin(horizontalMargin);
        fmt.setRightMargin(horizontalMargin);
        fmt.setTopMargin(verticalMargin);
        fmt.setBottomMargin(verticalMargin);
        doc->rootFrame()->setFrameFormat(fmt);

        // pageNumberPos must be in device coordinates, so scale to device here
        const int dpiy = p.device()->logicalDpiY();
        body = QRectF(0, 0, printer->width(), printer->height());
        pageNumberPos = QPointF(body.width() - horizontalMargin * dpiScaleX,
                                body.height() - verticalMargin * dpiScaleY
                                + QFontMetrics(doc->defaultFont(), p.device()).ascent()
                                + 5 * dpiy / 72.0);
        clonedDoc->setPageSize(body.size());
    }

    const QPageRanges pageRanges = printer->pageRanges();
    int fromPage = pageRanges.firstPage();
    int toPage = pageRanges.lastPage();

    if (fromPage == 0 && toPage == 0) {
        fromPage = 1;
        toPage = doc->pageCount();
    }
    // paranoia check
    fromPage = qMax(1, fromPage);
    toPage = qMin(doc->pageCount(), toPage);

    if (toPage < fromPage) {
        // if the user entered a page range outside the actual number
        // of printable pages, just return
        return;
    }

//    bool ascending = true;
//    if (printer->pageOrder() == QPrinter::LastPageFirst) {
//        int tmp = fromPage;
//        fromPage = toPage;
//        toPage = tmp;
//        ascending = false;
//    }

    int page = fromPage;
    while (true) {
        if (pageRanges.isEmpty() || pageRanges.contains(page))
            printPage(page, &p, doc, body, pageNumberPos);

        if (page == toPage)
            break;
        ++page;
        if (!printer->newPage())
            return;
    }
}